

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int state;
  size_t sVar7;
  char *pcVar8;
  long lStackY_21b0;
  int in_stack_ffffffffffffde58;
  int createNewGroup;
  int local_2178 [12];
  int repeat [10];
  int polls [10];
  uint local_20e8 [12];
  int local_20b8 [12];
  int local_2088 [12];
  char *cmd [4];
  int exceptions [10];
  
  if (argc == 2) {
    lStackY_21b0 = 8;
LAB_00102954:
    uVar3 = atoi(*(char **)((long)argv + lStackY_21b0));
  }
  else {
    uVar3 = 0;
    if ((argc == 3) && (iVar2 = strcmp(argv[1],"run"), uVar3 = 0, iVar2 == 0)) {
      lStackY_21b0 = 0x10;
      goto LAB_00102954;
    }
  }
  uVar1 = uVar3 - 1;
  if ((argc != 3) || (9 < uVar1 && (uVar3 != 0x6e && (uVar3 & 0xfffffffe) != 0x6c))) {
    if (9 < uVar1) {
      if (((2 < argc) && (*argv[1] == '0')) && (argv[1][1] == '\0')) {
        iVar2 = runChild(argv + 2,4,0,0,0,1,in_stack_ffffffffffffde58,0.0,0,1,0,0,0);
        return iVar2;
      }
      fprintf(_stdout,"Usage: %s <test number>\n",*argv);
      return 1;
    }
    exceptions[0] = 0;
    exceptions[1] = 0;
    exceptions[4] = 0;
    exceptions[5] = 0;
    exceptions[6] = 0;
    exceptions[7] = 0;
    local_2178[3] = 1;
    exceptions[2] = 0;
    exceptions[3] = 1;
    exceptions[8] = 0;
    exceptions[9] = 3;
    local_2178[0] = 0;
    local_2178[4] = 0;
    local_2178[5] = 0;
    local_2178[6] = 0;
    local_2178[7] = 0;
    local_2178[1] = 0x7b;
    local_2178[2] = 1;
    local_2178[8] = 1;
    local_2178[9] = 1;
    local_2088[4] = 0;
    local_2088[5] = 0;
    local_2088[6] = 0;
    local_2088[7] = 0;
    local_2088[0] = 0;
    local_2088[1] = 0;
    local_2088[2] = 0;
    local_2088[3] = 0;
    local_2088[8] = 1;
    local_2088[9] = 1;
    polls[4] = 0;
    polls[5] = 0;
    polls[0] = 0;
    polls[1] = 0;
    polls[2] = 0;
    polls[3] = 0;
    polls[8] = 0;
    polls[9] = 0;
    polls[6] = 1;
    polls[7] = 0;
    repeat[8] = 1;
    repeat[9] = 1;
    repeat[4] = 1;
    repeat[5] = 1;
    repeat[6] = 1;
    repeat[7] = 1;
    repeat[0] = 0x101;
    repeat[1] = 1;
    repeat[2] = 1;
    repeat[3] = 1;
    local_20b8[4] = 0;
    local_20b8[5] = 0;
    local_20b8[6] = 0;
    local_20b8[7] = 0;
    local_20b8[0] = 0;
    local_20b8[1] = 0;
    local_20b8[2] = 0;
    local_20b8[3] = 0;
    local_20b8[8] = 1;
    local_20b8[9] = 1;
    local_20e8[4] = 0;
    local_20e8[5] = 0;
    local_20e8[6] = 0;
    local_20e8[7] = 0;
    local_20e8[0] = 0;
    local_20e8[1] = 0;
    local_20e8[2] = 0;
    local_20e8[3] = 0;
    local_20e8[8] = 3;
    local_20e8[9] = 2;
    pcVar8 = getenv("KWSYS_TEST_PROCESS_1_COUNT");
    if ((pcVar8 != (char *)0x0) &&
       (lVar5 = strtol(pcVar8,(char **)0x0,10), lVar5 - 0xbU < 0x7ffffffffffffff4)) {
      repeat[0] = (int)lVar5;
    }
    cmd[0] = *argv;
    cmd[1] = "run";
    cmd[2] = argv[1];
    cmd[3] = (char *)0x0;
    fprintf(_stdout,"Output on stdout before test %d.\n",(ulong)uVar3);
    fprintf(_stderr,"Output on stderr before test %d.\n",(ulong)uVar3);
    fflush(_stdout);
    fflush(_stderr);
    uVar6 = (ulong)uVar1;
    iVar2 = runChild(cmd,*(int *)(&DAT_00107080 + uVar6 * 4),exceptions[uVar6],local_2178[uVar6],
                     local_2088[uVar6],*(int *)(&DAT_001070b0 + uVar6 * 4),in_stack_ffffffffffffde58
                     ,*(double *)(&DAT_001070e0 + uVar6 * 8),polls[uVar6],repeat[uVar6],0,
                     local_20b8[uVar6],local_20e8[uVar6]);
    fprintf(_stdout,"Output on stdout after test %d.\n",(ulong)uVar3);
    fprintf(_stderr,"Output on stderr after test %d.\n",(ulong)uVar3);
    fflush(_stdout);
    goto LAB_00103442;
  }
  switch(uVar1) {
  case 0:
    sVar7 = 0x28;
    fwrite("Output on stdout from test returning 0.\n",0x28,1,_stdout);
    pcVar8 = "Output on stderr from test returning 0.\n";
    goto LAB_00103141;
  case 1:
    fwrite("Output on stdout from test returning 123.\n",0x2a,1,_stdout);
    fwrite("Output on stderr from test returning 123.\n",0x2a,1,_stderr);
    return 0x7b;
  case 2:
    fwrite("Output before sleep on stdout from timeout test.\n",0x31,1,_stdout);
    fwrite("Output before sleep on stderr from timeout test.\n",0x31,1,_stderr);
    fflush(_stdout);
    fflush(_stderr);
    sleep(0xf);
    sVar7 = 0x30;
    fwrite("Output after sleep on stdout from timeout test.\n",0x30,1,_stdout);
    pcVar8 = "Output after sleep on stderr from timeout test.\n";
    goto LAB_00103141;
  case 3:
    fwrite("Output before crash on stdout from crash test.\n",0x2f,1,_stdout);
    fwrite("Output before crash on stderr from crash test.\n",0x2f,1,_stderr);
    fflush(_stdout);
    fflush(_stderr);
    _DAT_00000004 = 0;
    sVar7 = 0x2e;
    fwrite("Output after crash on stdout from crash test.\n",0x2e,1,_stdout);
    pcVar8 = "Output after crash on stderr from crash test.\n";
LAB_00103141:
    fwrite(pcVar8,sVar7,1,_stderr);
    return 0;
  case 4:
    exceptions._0_8_ = *argv;
    exceptions._8_8_ = anon_var_dwarf_4a;
    exceptions._16_8_ = anon_var_dwarf_2db;
    exceptions[6] = 0;
    exceptions[7] = 0;
    fwrite("Output on stdout before recursive test.\n",0x28,1,_stdout);
    fwrite("Output on stderr before recursive test.\n",0x28,1,_stderr);
    fflush(_stdout);
    fflush(_stderr);
    iVar2 = runChild((char **)exceptions,2,1,1,1,1,in_stack_ffffffffffffde58,15.0,0,1,0,0,0);
    sVar7 = 0x27;
    fwrite("Output on stdout after recursive test.\n",0x27,1,_stdout);
    pcVar8 = "Output on stderr after recursive test.\n";
    break;
  case 5:
    for (lVar5 = 0; lVar5 != 0x2000; lVar5 = lVar5 + 1) {
      *(undefined1 *)((long)exceptions + lVar5) = 0x2e;
    }
    do {
      fwrite(exceptions,1,0x2001,_stdout);
      fflush(_stdout);
    } while( true );
  case 6:
    fwrite("Output on stdout before sleep.\n",0x1f,1,_stdout);
    fwrite("Output on stderr before sleep.\n",0x1f,1,_stderr);
    fflush(_stdout);
    fflush(_stderr);
    sleep(1);
    sVar7 = 0x1e;
    fwrite("Output on stdout after sleep.\n",0x1e,1,_stdout);
    pcVar8 = "Output on stderr after sleep.\n";
LAB_0010320e:
    fwrite(pcVar8,sVar7,1,_stderr);
    fflush(_stdout);
    fflush(_stderr);
    return 0;
  case 7:
    exceptions._0_8_ = *argv;
    exceptions._8_8_ = anon_var_dwarf_4a;
    exceptions._16_8_ = anon_var_dwarf_341;
    exceptions[6] = 0;
    exceptions[7] = 0;
    fwrite("Output on stdout before grandchild test.\n",0x29,1,_stdout);
    fwrite("Output on stderr before grandchild test.\n",0x29,1,_stderr);
    fflush(_stdout);
    fflush(_stderr);
    iVar2 = 1;
    createNewGroup = 0;
    state = 7;
    uVar3 = 0x40240000;
    iVar4 = 0;
    goto LAB_00102ff1;
  case 8:
    exceptions._0_8_ = *argv;
    exceptions._8_8_ = anon_var_dwarf_4a;
    exceptions._16_8_ = anon_var_dwarf_373;
    exceptions[6] = 0;
    exceptions[7] = 0;
    fwrite("Output on stdout before grandchild test.\n",0x29,1,_stdout);
    fwrite("Output on stderr before grandchild test.\n",0x29,1,_stderr);
    fflush(_stdout);
    fflush(_stderr);
    iVar2 = runChild((char **)exceptions,4,0,0,1,1,in_stack_ffffffffffffde58,30.0,0,1,0,0,0);
    sleep(1);
    goto LAB_0010335f;
  case 9:
    exceptions._0_8_ = *argv;
    exceptions._8_8_ = anon_var_dwarf_4a;
    exceptions._16_8_ = anon_var_dwarf_37e;
    exceptions[6] = 0;
    exceptions[7] = 0;
    fwrite("Output on stdout before grandchild test.\n",0x29,1,_stdout);
    fwrite("Output on stderr before grandchild test.\n",0x29,1,_stderr);
    fflush(_stdout);
    fflush(_stderr);
    iVar2 = 0;
    createNewGroup = 1;
    state = 2;
    iVar4 = 3;
    uVar3 = 0x403e0000;
LAB_00102ff1:
    iVar2 = runChild((char **)exceptions,state,iVar4,iVar2,1,1,in_stack_ffffffffffffde58,
                     (double)((ulong)uVar3 << 0x20),0,1,iVar2,createNewGroup,0);
LAB_0010335f:
    sVar7 = 0x28;
    fwrite("Output on stdout after grandchild test.\n",0x28,1,_stdout);
    pcVar8 = "Output on stderr after grandchild test.\n";
    break;
  default:
    if (uVar3 != 0x6d) {
      if (uVar3 == 0x6c) {
        fwrite("Output on stdout from grandchild before sleep.\n",0x2f,1,_stdout);
        fwrite("Output on stderr from grandchild before sleep.\n",0x2f,1,_stderr);
        fflush(_stdout);
        fflush(_stderr);
        fclose(_stdout);
        fclose(_stderr);
        sleep(0xf);
        return 0;
      }
      if (uVar3 != 0x6e) {
        fprintf(_stderr,"Invalid test number %d.\n",(ulong)uVar3);
        return 1;
      }
      fwrite("Output on stdout from grandchild before sleep.\n",0x2f,1,_stdout);
      fwrite("Output on stderr from grandchild before sleep.\n",0x2f,1,_stderr);
      fflush(_stdout);
      fflush(_stderr);
      sleep(6);
      sVar7 = 0x2e;
      fwrite("Output on stdout from grandchild after sleep.\n",0x2e,1,_stdout);
      pcVar8 = "Output on stderr from grandchild after sleep.\n";
      goto LAB_0010320e;
    }
    iVar2 = 0;
    memset((sigset_t *)(exceptions + 2),0,0x90);
    exceptions[0] = 1;
    exceptions[1] = 0;
    sigemptyset((sigset_t *)(exceptions + 2));
    iVar4 = sigaction(2,(sigaction *)exceptions,(sigaction *)0x0);
    if (iVar4 < 0) {
      return 1;
    }
    fwrite("Output on stdout from grandchild before sleep.\n",0x2f,1,_stdout);
    fwrite("Output on stderr from grandchild before sleep.\n",0x2f,1,_stderr);
    fflush(_stdout);
    fflush(_stderr);
    sleep(9);
    sVar7 = 0x2e;
    fwrite("Output on stdout from grandchild after sleep.\n",0x2e,1,_stdout);
    pcVar8 = "Output on stderr from grandchild after sleep.\n";
  }
  fwrite(pcVar8,sVar7,1,_stderr);
  fflush(_stdout);
LAB_00103442:
  fflush(_stderr);
  return iVar2;
}

Assistant:

int main(int argc, const char* argv[])
{
  int n = 0;

#ifdef _WIN32
  int i;
  char new_args[10][_MAX_PATH];
  LPWSTR* w_av = CommandLineToArgvW(GetCommandLineW(), &argc);
  for (i = 0; i < argc; i++) {
    kwsysEncoding_wcstombs(new_args[i], w_av[i], _MAX_PATH);
    argv[i] = new_args[i];
  }
  LocalFree(w_av);
#endif

#if 0
    {
    HANDLE out = GetStdHandle(STD_OUTPUT_HANDLE);
    DuplicateHandle(GetCurrentProcess(), out,
                    GetCurrentProcess(), &out, 0, FALSE,
                    DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE);
    SetStdHandle(STD_OUTPUT_HANDLE, out);
    }
    {
    HANDLE out = GetStdHandle(STD_ERROR_HANDLE);
    DuplicateHandle(GetCurrentProcess(), out,
                    GetCurrentProcess(), &out, 0, FALSE,
                    DUPLICATE_SAME_ACCESS | DUPLICATE_CLOSE_SOURCE);
    SetStdHandle(STD_ERROR_HANDLE, out);
    }
#endif
  if (argc == 2) {
    n = atoi(argv[1]);
  } else if (argc == 3 && strcmp(argv[1], "run") == 0) {
    n = atoi(argv[2]);
  }
  /* Check arguments.  */
  if (((n >= 1 && n <= 10) || n == 108 || n == 109 || n == 110) && argc == 3) {
    /* This is the child process for a requested test number.  */
    switch (n) {
      case 1:
        return test1(argc, argv);
      case 2:
        return test2(argc, argv);
      case 3:
        return test3(argc, argv);
      case 4:
        return test4(argc, argv);
      case 5:
        return test5(argc, argv);
      case 6:
        test6(argc, argv);
        return 0;
      case 7:
        return test7(argc, argv);
      case 8:
        return test8(argc, argv);
      case 9:
        return test9(argc, argv);
      case 10:
        return test10(argc, argv);
      case 108:
        return test8_grandchild(argc, argv);
      case 109:
        return test9_grandchild(argc, argv);
      case 110:
        return test10_grandchild(argc, argv);
    }
    fprintf(stderr, "Invalid test number %d.\n", n);
    return 1;
  } else if (n >= 1 && n <= 10) {
    /* This is the parent process for a requested test number.  */
    int states[10] = {
      kwsysProcess_State_Exited,   kwsysProcess_State_Exited,
      kwsysProcess_State_Expired,  kwsysProcess_State_Exception,
      kwsysProcess_State_Exited,   kwsysProcess_State_Expired,
      kwsysProcess_State_Exited,   kwsysProcess_State_Exited,
      kwsysProcess_State_Expired,  /* Ctrl+C handler test */
      kwsysProcess_State_Exception /* Process group test */
    };
    int exceptions[10] = {
      kwsysProcess_Exception_None,  kwsysProcess_Exception_None,
      kwsysProcess_Exception_None,
#ifdef CRASH_USING_ABORT
      kwsysProcess_Exception_Other,
#else
      kwsysProcess_Exception_Fault,
#endif
      kwsysProcess_Exception_None,  kwsysProcess_Exception_None,
      kwsysProcess_Exception_None,  kwsysProcess_Exception_None,
      kwsysProcess_Exception_None,  kwsysProcess_Exception_Interrupt
    };
    int values[10] = { 0, 123, 1, 1, 0, 0, 0, 0, 1, 1 };
    int shares[10] = { 0, 0, 0, 0, 0, 0, 0, 0, 1, 1 };
    int outputs[10] = { 1, 1, 1, 1, 1, 0, 1, 1, 1, 1 };
    int delays[10] = { 0, 0, 0, 0, 0, 1, 0, 0, 0, 0 };
    double timeouts[10] = { 10, 10, 10, 30, 30, 10, -1, 10, 6, 4 };
    int polls[10] = { 0, 0, 0, 0, 0, 0, 1, 0, 0, 0 };
    int repeat[10] = { 257, 1, 1, 1, 1, 1, 1, 1, 1, 1 };
    int createNewGroups[10] = { 0, 0, 0, 0, 0, 0, 0, 0, 1, 1 };
    unsigned int interruptDelays[10] = { 0, 0, 0, 0, 0, 0, 0, 0, 3, 2 };
    int r;
    const char* cmd[4];
#ifdef _WIN32
    char* argv0 = 0;
#endif
    char* test1IterationsStr = getenv("KWSYS_TEST_PROCESS_1_COUNT");
    if (test1IterationsStr) {
      long int test1Iterations = strtol(test1IterationsStr, 0, 10);
      if (test1Iterations > 10 && test1Iterations != LONG_MAX) {
        repeat[0] = (int)test1Iterations;
      }
    }
#ifdef _WIN32
    if (n == 0 && (argv0 = strdup(argv[0]))) {
      /* Try converting to forward slashes to see if it works.  */
      char* c;
      for (c = argv0; *c; ++c) {
        if (*c == '\\') {
          *c = '/';
        }
      }
      cmd[0] = argv0;
    } else {
      cmd[0] = argv[0];
    }
#else
    cmd[0] = argv[0];
#endif
    cmd[1] = "run";
    cmd[2] = argv[1];
    cmd[3] = 0;
    fprintf(stdout, "Output on stdout before test %d.\n", n);
    fprintf(stderr, "Output on stderr before test %d.\n", n);
    fflush(stdout);
    fflush(stderr);
    r = runChild(cmd, states[n - 1], exceptions[n - 1], values[n - 1],
                 shares[n - 1], outputs[n - 1], delays[n - 1], timeouts[n - 1],
                 polls[n - 1], repeat[n - 1], 0, createNewGroups[n - 1],
                 interruptDelays[n - 1]);
    fprintf(stdout, "Output on stdout after test %d.\n", n);
    fprintf(stderr, "Output on stderr after test %d.\n", n);
    fflush(stdout);
    fflush(stderr);
#if defined(_WIN32)
    free(argv0);
#endif
    return r;
  } else if (argc > 2 && strcmp(argv[1], "0") == 0) {
    /* This is the special debugging test to run a given command
       line.  */
    const char** cmd = argv + 2;
    int state = kwsysProcess_State_Exited;
    int exception = kwsysProcess_Exception_None;
    int value = 0;
    double timeout = 0;
    int r =
      runChild(cmd, state, exception, value, 0, 1, 0, timeout, 0, 1, 0, 0, 0);
    return r;
  } else {
    /* Improper usage.  */
    fprintf(stdout, "Usage: %s <test number>\n", argv[0]);
    return 1;
  }
}